

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int lsaveproto(lua_State *L)

{
  int iVar1;
  sproto *psVar2;
  ulong uVar3;
  int index;
  sproto *sp;
  lua_State *L_local;
  
  psVar2 = (sproto *)lua_touserdata(L,1);
  uVar3 = luaL_optinteger(L,2,0);
  iVar1 = (int)uVar3;
  if ((iVar1 < 0) || (0xf < iVar1)) {
    L_local._4_4_ = luaL_error(L,"Invalid global slot index %d",uVar3 & 0xffffffff);
  }
  else {
    G_sproto[iVar1] = psVar2;
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int
lsaveproto(lua_State *L) {
	struct sproto * sp = lua_touserdata(L, 1);
	int index = luaL_optinteger(L, 2, 0);
	if (index < 0 || index >= MAX_GLOBALSPROTO) {
		return luaL_error(L, "Invalid global slot index %d", index);
	}
	/* TODO : release old object (memory leak now, but thread safe)*/
	G_sproto[index] = sp;
	return 0;
}